

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsmcpl.c
# Opt level: O2

int phits2mcpl2(char *phitsdumpfile,char *mcplfile,int opt_dp,int opt_gzip,char *inputdeckfile,
               char *dumpsummaryfile)

{
  int iVar1;
  int iVar2;
  phits_file_t ff;
  undefined8 uVar3;
  char *pcVar4;
  double *pdVar5;
  phits_particle_t *ppVar6;
  char *pcVar7;
  size_t sVar8;
  void *__dest;
  uint64_t cfgfile_lbuf;
  char *cfgfile_buf;
  int local_34;
  
  local_34 = opt_gzip;
  ff = phits_open_file(phitsdumpfile);
  uVar3 = mcpl_create_outfile(mcplfile);
  mcpl_hdr_set_srcname(uVar3,"PHITS");
  mcpl_hdr_add_comment(uVar3,"Converted from PHITS with phits2mcpl");
  if (opt_dp != 0) {
    mcpl_enable_doubleprec(uVar3);
  }
  iVar1 = phits_has_polarisation(ff);
  if (iVar1 != 0) {
    mcpl_enable_polarisation(uVar3);
  }
  if (inputdeckfile == (char *)0x0) {
LAB_001029f8:
    if (dumpsummaryfile != (char *)0x0) {
      mcpl_read_file_to_buffer(dumpsummaryfile,0x6400000,1,&cfgfile_lbuf,&cfgfile_buf);
      pcVar7 = cfgfile_buf;
      pcVar4 = strstr(cfgfile_buf,"dump");
      if (pcVar4 == (char *)0x0) {
        pcVar7 = 
        "Error: specified dump summary file %s looks invalid as it does not contain the word \"dump\".\n"
        ;
        goto LAB_00102bcd;
      }
      mcpl_hdr_add_data(uVar3,"phits_dump_summary_file",(undefined4)cfgfile_lbuf,pcVar7);
      free(cfgfile_buf);
    }
    iVar1 = 1;
    pdVar5 = (double *)mcpl_get_empty_particle(uVar3);
    while (ppVar6 = phits_load_particle(ff), ppVar6 != (phits_particle_t *)0x0) {
      if (ppVar6->pdgcode == 0) {
        printf("Warning: ignored particle with no PDG code set (raw phits kt code was %li).\n",
               ppVar6->rawtype);
      }
      else {
        *(int *)(pdVar5 + 0xc) = (int)ppVar6->pdgcode;
        pdVar5[4] = ppVar6->x;
        pdVar5[5] = ppVar6->y;
        pdVar5[6] = ppVar6->z;
        pdVar5[7] = ppVar6->dirx;
        pdVar5[8] = ppVar6->diry;
        pdVar5[9] = ppVar6->dirz;
        pdVar5[1] = ppVar6->polx;
        pdVar5[2] = ppVar6->poly;
        pdVar5[3] = ppVar6->polz;
        pdVar5[10] = ppVar6->time * 1e-06;
        pdVar5[0xb] = ppVar6->weight;
        *pdVar5 = ppVar6->ekin;
        mcpl_add_particle(uVar3,pdVar5);
      }
    }
    pcVar7 = (char *)mcpl_outfile_filename(uVar3);
    sVar8 = strlen(pcVar7);
    __dest = malloc(sVar8 + 1);
    if (__dest == (void *)0x0) {
      puts("Error: Memory allocation error");
      iVar1 = 0;
    }
    else {
      memcpy(__dest,pcVar7,sVar8 + 1);
      if (local_34 == 0) {
        mcpl_close_outfile(uVar3);
        pcVar7 = "";
      }
      else {
        iVar2 = mcpl_closeandgzip_outfile(uVar3);
        pcVar7 = ".gz";
        if (iVar2 == 0) {
          pcVar7 = "";
        }
      }
      phits_close_file(ff);
      printf("Created %s%s\n",__dest,pcVar7);
      free(__dest);
    }
  }
  else {
    mcpl_read_file_to_buffer(inputdeckfile,0x6400000,1,&cfgfile_lbuf,&cfgfile_buf);
    pcVar7 = cfgfile_buf;
    pcVar4 = strstr(cfgfile_buf,"dump");
    if (pcVar4 != (char *)0x0) {
      mcpl_hdr_add_data(uVar3,"phits_input_deck",(undefined4)cfgfile_lbuf,pcVar7);
      free(cfgfile_buf);
      goto LAB_001029f8;
    }
    pcVar7 = 
    "Error: specified configuration file %s looks invalid as it does not contain the word \"dump\".\n"
    ;
    dumpsummaryfile = inputdeckfile;
LAB_00102bcd:
    iVar1 = 0;
    printf(pcVar7,dumpsummaryfile);
  }
  return iVar1;
}

Assistant:

int phits2mcpl2( const char * phitsdumpfile, const char * mcplfile,
                 int opt_dp, int opt_gzip,
                 const char * inputdeckfile,
                 const char * dumpsummaryfile )
{
  phits_file_t f = phits_open_file(phitsdumpfile);
  mcpl_outfile_t mcplfh = mcpl_create_outfile(mcplfile);

  mcpl_hdr_set_srcname(mcplfh,"PHITS");
  mcpl_hdr_add_comment(mcplfh,"Converted from PHITS with phits2mcpl");

  if (opt_dp)
    mcpl_enable_doubleprec(mcplfh);

  if (phits_has_polarisation(f))
    mcpl_enable_polarisation(mcplfh);

  if (inputdeckfile) {
    char* cfgfile_buf;
    uint64_t cfgfile_lbuf;
    mcpl_read_file_to_buffer( inputdeckfile,
                              104857600,//100mb max
                              1,//text
                              &cfgfile_lbuf,
                              &cfgfile_buf );

    //We won't do much for sanity checks since we want to avoid the risk of
    //false positives, but at least the word "dump" should occur in both input
    //deck and dump summary files:
    if (!strstr((const char*)cfgfile_buf, "dump")) {
      printf("Error: specified configuration file %s looks invalid as it"
             " does not contain the word \"dump\".\n",inputdeckfile);
      return 0;
    }
    mcpl_hdr_add_data( mcplfh,
                       "phits_input_deck",
                       (uint32_t)cfgfile_lbuf,
                       (const char *)cfgfile_buf );
    free(cfgfile_buf);
  }
  if (dumpsummaryfile) {
    char* summaryfile_buf;
    uint64_t summaryfile_lbuf;
    mcpl_read_file_to_buffer( dumpsummaryfile,
                              104857600,//100mb max
                              1,//text
                              &summaryfile_lbuf,
                              &summaryfile_buf );

    //Same check as for the input deck above:
    if (!strstr(summaryfile_buf, "dump")) {
      printf("Error: specified dump summary file %s looks invalid"
             " as it does not contain the word \"dump\".\n",dumpsummaryfile);
      return 0;
    }
    mcpl_hdr_add_data( mcplfh,
                       "phits_dump_summary_file",
                       (uint32_t)summaryfile_lbuf,
                       summaryfile_buf );
    free(summaryfile_buf);
  }

  mcpl_particle_t* mcpl_particle = mcpl_get_empty_particle(mcplfh);

  while ( 1 ) {
    const phits_particle_t * p = phits_load_particle(f);
    if (!p)
      break;

    if (!p->pdgcode) {
      printf("Warning: ignored particle with no PDG code set (raw phits kt"
             " code was %li).\n",p->rawtype);
      continue;
    }
    mcpl_particle->pdgcode = p->pdgcode;
    mcpl_particle->position[0] = p->x;//already in cm
    mcpl_particle->position[1] = p->y;//already in cm
    mcpl_particle->position[2] = p->z;//already in cm
    mcpl_particle->direction[0] = p->dirx;
    mcpl_particle->direction[1] = p->diry;
    mcpl_particle->direction[2] = p->dirz;
    mcpl_particle->polarisation[0] = p->polx;
    mcpl_particle->polarisation[1] = p->poly;
    mcpl_particle->polarisation[2] = p->polz;
    mcpl_particle->time = p->time * 1.0e-6;//nanoseconds (PHITS) to milliseconds
                                           //(MCPL)
    mcpl_particle->weight = p->weight;
    mcpl_particle->ekin = p->ekin;//already in MeV
    mcpl_add_particle(mcplfh,mcpl_particle);
  }

  const char * tmp = mcpl_outfile_filename(mcplfh);
  size_t laf = strlen(tmp);
  char * actual_filename = malloc(laf+1);
  if (!actual_filename) {
    printf("Error: Memory allocation error\n");
    return 0;
  }
  memcpy(actual_filename,tmp,laf+1);

  int did_gzip = 0;
  if (opt_gzip)
    did_gzip = mcpl_closeandgzip_outfile(mcplfh);
  else
    mcpl_close_outfile(mcplfh);
  phits_close_file(f);

  printf("Created %s%s\n",actual_filename,(did_gzip?".gz":""));
  free(actual_filename);
  return 1;
}